

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O1

void __thiscall sznet::net::Connector::handleWrite(Connector *this)

{
  bool bVar1;
  sz_sock sockfd;
  int v;
  LogStream *this_00;
  char **ppcVar2;
  char *pcVar3;
  undefined8 uVar4;
  SourceFile file;
  SourceFile file_00;
  SourceFile file_01;
  Logger local_ff8;
  
  if (g_logLevel < 1) {
    file._8_8_ = 0xd;
    file.m_data = "Connector.cpp";
    Logger::Logger(&local_ff8,file,0xa2,TRACE,"handleWrite");
    if (0x17 < (uint)(((int)&local_ff8 + 0xfb0) - (int)local_ff8.m_impl.m_stream.m_buffer.m_cur)) {
      builtin_strncpy(local_ff8.m_impl.m_stream.m_buffer.m_cur,"Connector::handleWrite ",0x17);
      local_ff8.m_impl.m_stream.m_buffer.m_cur = local_ff8.m_impl.m_stream.m_buffer.m_cur + 0x17;
    }
    LogStream::operator<<(&local_ff8.m_impl.m_stream,this->m_state);
    Logger::~Logger(&local_ff8);
  }
  if (this->m_state != kDisconnected) {
    if (this->m_state != kConnecting) {
      __assert_fail("m_state == kDisconnected",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Connector.cpp"
                    ,0xc6,"void sznet::net::Connector::handleWrite()");
    }
    sockfd = removeAndResetChannel(this);
    v = sockets::sz_sock_geterror(sockfd);
    if (v == 0) {
      bVar1 = sockets::sz_sock_isselfconnect(sockfd);
      if (!bVar1) {
        this->m_state = kConnected;
        if (this->m_connect != true) {
          sockets::sz_closesocket(sockfd);
          return;
        }
        local_ff8.m_impl.m_time.m_microSecondsSinceEpoch._0_4_ = sockfd;
        if ((this->m_newConnectionCallback).super__Function_base._M_manager != (_Manager_type)0x0) {
          (*(this->m_newConnectionCallback)._M_invoker)
                    ((_Any_data *)&this->m_newConnectionCallback,(int *)&local_ff8);
          return;
        }
        uVar4 = std::__throw_bad_function_call();
        Logger::~Logger(&local_ff8);
        _Unwind_Resume(uVar4);
      }
      file_01._8_8_ = 0xd;
      file_01.m_data = "Connector.cpp";
      Logger::Logger(&local_ff8,file_01,0xb2,WARN);
      if (0x25 < (uint)(((int)&local_ff8 + 0xfb0) - (int)local_ff8.m_impl.m_stream.m_buffer.m_cur))
      {
        builtin_strncpy(local_ff8.m_impl.m_stream.m_buffer.m_cur,
                        "Connector::handleWrite - Self connect",0x25);
        local_ff8.m_impl.m_stream.m_buffer.m_cur = local_ff8.m_impl.m_stream.m_buffer.m_cur + 0x25;
      }
    }
    else {
      file_00._8_8_ = 0xd;
      file_00.m_data = "Connector.cpp";
      Logger::Logger(&local_ff8,file_00,0xaa,WARN);
      if (0x24 < (uint)(((int)&local_ff8 + 0xfb0) - (int)local_ff8.m_impl.m_stream.m_buffer.m_cur))
      {
        builtin_strncpy(local_ff8.m_impl.m_stream.m_buffer.m_cur,
                        "Connector::handleWrite - SO_ERROR = ",0x24);
        local_ff8.m_impl.m_stream.m_buffer.m_cur = local_ff8.m_impl.m_stream.m_buffer.m_cur + 0x24;
      }
      this_00 = LogStream::operator<<(&local_ff8.m_impl.m_stream,v);
      ppcVar2 = &(this_00->m_buffer).m_cur;
      pcVar3 = (this_00->m_buffer).m_cur;
      if (((int)ppcVar2 - (int)pcVar3 & 0xfffffffeU) != 0) {
        *pcVar3 = ' ';
        *ppcVar2 = *ppcVar2 + 1;
      }
      pcVar3 = sz_strerror_tl(v);
      LogStream::operator<<(this_00,pcVar3);
    }
    Logger::~Logger(&local_ff8);
    retry(this,sockfd);
  }
  return;
}

Assistant:

void Connector::handleWrite()
{
	LOG_TRACE << "Connector::handleWrite " << m_state;

	if (m_state == kConnecting)
	{
		sockets::sz_sock sockfd = removeAndResetChannel();
		int err = sockets::sz_sock_geterror(sockfd);
		if (err)
		{
			LOG_WARN << "Connector::handleWrite - SO_ERROR = "
				<< err << " " << sz_strerror_tl(err);
			retry(sockfd);
		}
		else if (sockets::sz_sock_isselfconnect(sockfd))
		{
			// ���������ӣ���(source IP, source port) = (destination IP, destination port)
			// ������ʽ���ǳ�����������
			LOG_WARN << "Connector::handleWrite - Self connect";
			retry(sockfd);
		}
		else
		{
			// ���ӳɹ�
			setState(kConnected);
			if (m_connect)
			{
				m_newConnectionCallback(sockfd);
			}
			else
			{
				sockets::sz_closesocket(sockfd);
			}
		}
	}
	else
	{
		// what happened?
		assert(m_state == kDisconnected);
	}
}